

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  uint uVar7;
  void *__s;
  Vec_Int_t *vMemory;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Int_t *pVVar10;
  word *puTruth;
  long lVar11;
  char *pcVar12;
  Mem_Flex_t *pMan;
  long lVar13;
  
  pVVar9 = pNtk->vObjs;
  iVar1 = pVVar9->nSize;
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  memset(__s,0,(long)iVar1 * 4);
  pVVar2 = pNtk->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar11 = 0;
    do {
      iVar6 = *(int *)((long)ppvVar3[lVar11] + 0x40);
      if (((long)iVar6 < 0) || (iVar1 <= iVar6)) goto LAB_0026f071;
      *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)ppvVar3[lVar11] + 0x10);
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar2->nSize);
  }
  if (0 < pVVar9->nSize) {
    ppvVar3 = pVVar9->pArray;
    lVar11 = 0;
    do {
      pvVar4 = ppvVar3[lVar11];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
        iVar6 = *(int *)((long)pvVar4 + 0x40);
        if (0 < (long)iVar6) {
          if (iVar1 <= iVar6) {
LAB_0026f071:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)pvVar4 + 0x10);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        iVar6 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp);
        if (iVar6 == 0) {
          Abc_ObjRemoveFanins(pAVar5);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar11 < pVVar9->nSize);
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar8 = (int *)malloc(0x40000);
  vMemory->pArray = piVar8;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
      if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
         ((pAVar5->field_6).iTemp != 0)) {
        iVar6 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp);
        if (iVar6 == 0) {
          iVar6 = Sfm_NodeReadUsed(p,(pAVar5->field_6).iTemp);
          if (iVar6 == 0) {
            Abc_NtkDeleteObj(pAVar5);
          }
          else {
            pVVar10 = Sfm_NodeReadFanins(p,(pAVar5->field_6).iTemp);
            if (0 < pVVar10->nSize) {
              lVar13 = 0;
              do {
                iVar6 = pVVar10->pArray[lVar13];
                if (((long)iVar6 < 0) || (iVar1 <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar6 = *(int *)((long)__s + (long)iVar6 * 4);
                if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar6]);
                lVar13 = lVar13 + 1;
              } while (lVar13 < pVVar10->nSize);
            }
            puTruth = Sfm_NodeReadTruth(p,(pAVar5->field_6).iTemp);
            if (*puTruth == 0xffffffffffffffff) {
              pMan = (Mem_Flex_t *)pNtk->pManFunc;
              pcVar12 = " 1\n";
LAB_0026ef80:
              pcVar12 = Abc_SopRegister(pMan,pcVar12);
              (pAVar5->field_5).pData = pcVar12;
            }
            else {
              if (*puTruth == 0) {
                pMan = (Mem_Flex_t *)pNtk->pManFunc;
                pcVar12 = " 0\n";
                goto LAB_0026ef80;
              }
              uVar7 = Kit_TruthIsop((uint *)puTruth,pVVar10->nSize,vMemory,1);
              if (pVVar10->nSize < 1) {
                __assert_fail("Vec_IntSize(vArray) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                              ,0xe4,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
              }
              if (1 < uVar7) {
                __assert_fail("RetValue == 0 || RetValue == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                              ,0xe5,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
              }
              pcVar12 = Abc_SopCreateFromIsop((Mem_Flex_t *)pNtk->pManFunc,pVVar10->nSize,vMemory);
              (pAVar5->field_5).pData = pcVar12;
              if (uVar7 != 0) {
                Abc_SopComplement(pcVar12);
              }
            }
            iVar6 = Abc_SopGetVarNum((char *)(pAVar5->field_5).pData);
            if (iVar6 != pVVar10->nSize) {
              __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                            ,0xea,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar11 < pVVar9->nSize);
  }
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        // update function
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        if ( pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
        else if ( ~pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 1\n" );
        else
        {
            int RetValue = Kit_TruthIsop( (unsigned *)pTruth, Vec_IntSize(vArray), vCover, 1 );
            assert( Vec_IntSize(vArray) > 0 );
            assert( RetValue == 0 || RetValue == 1 );
            pNode->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), vCover );
            if ( RetValue )
                Abc_SopComplement( (char *)pNode->pData );
        }
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}